

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O2

void __thiscall write_point_le::operator()(write_point_le *this,way_point_le *point,xr_writer *w)

{
  undefined4 in_EAX;
  undefined4 uStack_18;
  uint32_t local_14;
  
  uStack_18 = in_EAX;
  xray_re::xr_writer::w_fvector3(w,&(point->super_way_point).position);
  _uStack_18 = CONCAT44((point->super_way_point).flags,uStack_18);
  (*w->_vptr_xr_writer[2])(w,&local_14,4);
  uStack_18 = CONCAT22(point->id,(undefined2)uStack_18);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_18 + 2,2);
  xray_re::xr_writer::w_sz(w,(string *)point);
  return;
}

Assistant:

void operator()(const way_point_le& point, xr_writer& w) const {
	w.w_fvector3(point.position);
	w.w_u32(point.flags);
	w.w_u16(point.id);
	w.w_sz(point.name);
}